

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O1

Iterator * __thiscall leveldb::Block::NewIterator(Block *this,Comparator *comparator)

{
  uint32_t num_restarts;
  char *data;
  Iter *this_00;
  Iterator *pIVar1;
  long in_FS_OFFSET;
  Slice local_58;
  Slice local_48;
  Status local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->size_ < 4) {
    local_48.data_ = "bad block contents";
    local_48.size_ = 0x12;
    local_58.data_ = "";
    local_58.size_ = 0;
    Status::Status(&local_38,kCorruption,&local_48,&local_58);
    this_00 = (Iter *)NewErrorIterator(&local_38);
    if (local_38.state_ != (char *)0x0) {
      operator_delete__(local_38.state_);
    }
  }
  else {
    data = this->data_;
    num_restarts = *(uint32_t *)(data + (this->size_ - 4));
    if (num_restarts == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        pIVar1 = NewEmptyIterator();
        return pIVar1;
      }
      goto LAB_00d519ff;
    }
    this_00 = (Iter *)operator_new(0x80);
    Iter::Iter(this_00,comparator,data,this->restart_offset_,num_restarts);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return &this_00->super_Iterator;
  }
LAB_00d519ff:
  __stack_chk_fail();
}

Assistant:

Iterator* Block::NewIterator(const Comparator* comparator) {
  if (size_ < sizeof(uint32_t)) {
    return NewErrorIterator(Status::Corruption("bad block contents"));
  }
  const uint32_t num_restarts = NumRestarts();
  if (num_restarts == 0) {
    return NewEmptyIterator();
  } else {
    return new Iter(comparator, data_, restart_offset_, num_restarts);
  }
}